

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::CharacterClassPass1<true>
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this)

{
  undefined1 *puVar1;
  uint32 *puVar2;
  EncodedChar EVar3;
  undefined **ppuVar4;
  CharSetNode *pCVar5;
  code *pcVar6;
  undefined2 uVar7;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  codepoint_t codePointValue;
  uint uVar12;
  uint uVar13;
  undefined4 *puVar14;
  Node *pNVar15;
  EncodedChar *pEVar16;
  SurrogatePairTracker *pSVar17;
  undefined4 extraout_var;
  Node *pNVar18;
  AltNode *pAVar19;
  AltNode *pAVar20;
  long *plVar21;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPVar22;
  byte bVar23;
  ulong uVar24;
  ArenaAllocator *pAVar25;
  CharSet<unsigned_int> *pCVar26;
  EncodedChar *pEVar27;
  uint uVar28;
  long lVar29;
  Char CVar30;
  Char CVar31;
  int iVar32;
  MatchSetNode *node;
  ulong uVar33;
  NodeTag *pNVar34;
  byte bVar35;
  uint totalCount;
  uint uVar36;
  AltNode *lastAltNode;
  undefined1 auVar37 [16];
  undefined1 local_928 [8];
  CharSet<unsigned_int> negatedSet;
  codepoint_t lowerCharOfRange;
  MatchSetNode local_3d8;
  undefined1 local_370 [8];
  CharSet<unsigned_int> codePointSet;
  Char local_6c;
  CharSet<unsigned_int> *pCStack_68;
  codepoint_t upperCharOfRange;
  bool local_59;
  byte bStack_58;
  undefined7 uStack_57;
  bool previousWasASurrogate;
  uint local_4c;
  Node *local_48;
  EncodedChar local_3a;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *local_38;
  
  local_38 = this;
  if (this->unicodeFlagPresent == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x842,"(containsSurrogates ? unicodeFlagPresent : true)",
                       "containsSurrogates ? unicodeFlagPresent : true");
    if (!bVar9) goto LAB_00ebbbaa;
    *puVar14 = 0;
  }
  pCStack_68 = (CharSet<unsigned_int> *)local_370;
  CharSet<unsigned_int>::CharSet(pCStack_68);
  local_3d8.super_Node.tag = MatchSet;
  local_3d8.super_Node.features = 0;
  local_3d8.super_Node._12_4_ = local_3d8.super_Node._12_4_ & 0xffff8000;
  local_3d8.super_Node.firstSet = (CharSet<char16_t> *)0x0;
  local_3d8.super_Node.followSet = (CharSet<char16_t> *)0x0;
  local_3d8.super_Node.prevConsumes.lower = 0;
  local_3d8.super_Node.prevConsumes.upper = 0xffffffff;
  local_3d8.super_Node.thisConsumes.lower = 0;
  local_3d8.super_Node.thisConsumes.upper = 0xffffffff;
  local_3d8.super_Node.followConsumes.lower = 0;
  local_3d8.super_Node.followConsumes.upper = 0xffffffff;
  local_3d8.super_Node._vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
  local_3d8.isNegation = false;
  local_3d8.needsEquivClass = true;
  CharSet<char16_t>::CharSet(&local_3d8.set);
  pmovsxbd(ZEXT816(0),0xff00ff);
  codePointSet.characterPlanes[0x10].rep._32_8_ = &PTR_LiteralLength_01542a10;
  pEVar16 = local_38->inputLim;
  pEVar27 = local_38->next;
  if (pEVar16 < pEVar27) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar9) goto LAB_00ebbbaa;
    *puVar14 = 0;
    pEVar16 = local_38->inputLim;
    pEVar27 = local_38->next;
  }
  local_3a = *pEVar27;
  if (*pEVar27 == L'^') {
    if (pEVar16 < pEVar27 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar9) goto LAB_00ebbbaa;
      *puVar14 = 0;
      pEVar16 = local_38->inputLim;
      pEVar27 = local_38->next;
    }
    pEVar27 = pEVar27 + 1;
    local_38->next = pEVar27;
  }
  if (pEVar16 < pEVar27) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar9) goto LAB_00ebbbaa;
    *puVar14 = 0;
    pEVar27 = local_38->next;
  }
  EVar3 = *pEVar27;
  local_59 = false;
  pPVar22 = local_38;
  if (EVar3 != L']') {
    uVar33 = 0xffffffff;
    local_48 = (Node *)__tls_get_addr(&PTR_01548f08);
    bVar23 = 0;
    local_4c = 0xffffffff;
    pPVar22 = local_38;
    bVar35 = 0;
    do {
      _bStack_58 = (undefined4 *)CONCAT71(uStack_57,bVar23);
      if (EVar3 == L'\\') {
        if (pPVar22->inputLim < pEVar27 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          pNVar15 = local_48;
          *(uint32 *)&local_48->_vptr_Node = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar9) goto LAB_00ebbbaa;
          *(uint32 *)&pNVar15->_vptr_Node = 0;
          pEVar27 = local_38->next;
          pPVar22 = local_38;
        }
        pEVar27 = pEVar27 + 1;
        pPVar22->next = pEVar27;
      }
      pSVar17 = pPVar22->currentSurrogatePairNode;
      CVar30 = (Char)uVar33;
      CVar31 = CVar30;
      if ((pSVar17 != (SurrogatePairTracker *)0x0) && (pSVar17->location == pEVar27)) {
        uVar33 = (ulong)pSVar17->value;
        uVar24 = (ulong)pSVar17->length;
        pEVar16 = pPVar22->inputLim;
        if (pEVar16 < pEVar27 + uVar24) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          pNVar15 = local_48;
          *(uint32 *)&local_48->_vptr_Node = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x86b,"(ECCanConsume(this->currentSurrogatePairNode->length))",
                             "ECCanConsume(this->currentSurrogatePairNode->length)");
          if (!bVar9) goto LAB_00ebbbaa;
          *(uint32 *)&pNVar15->_vptr_Node = 0;
          pSVar17 = local_38->currentSurrogatePairNode;
          uVar24 = (ulong)pSVar17->length;
          pEVar16 = local_38->inputLim;
          pEVar27 = local_38->next;
          pPVar22 = local_38;
        }
        if (pEVar16 < pEVar27 + uVar24) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          pNVar15 = local_48;
          *(uint32 *)&local_48->_vptr_Node = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xde,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar9) goto LAB_00ebbbaa;
          *(uint32 *)&pNVar15->_vptr_Node = 0;
          pEVar27 = local_38->next;
          pSVar17 = local_38->currentSurrogatePairNode;
          pPVar22 = local_38;
        }
        pPVar22->next = pEVar27 + uVar24;
        pPVar22->currentSurrogatePairNode = pSVar17->next;
        goto LAB_00ebaa06;
      }
      if (EVar3 == L'\\') {
        pNVar15 = ClassEscapePass1(pPVar22,(MatchCharNode *)
                                           (codePointSet.characterPlanes[0x10].rep.full.direct.vec +
                                           6),&local_3d8,&local_59);
        pPVar22 = local_38;
        if (pNVar15->tag == MatchSet) {
          if (local_4c != 0xffffffff) {
            if (local_38->unicodeFlagPresent == true) {
              Fail(local_38,-0x7ff5e9d3);
            }
            pPVar22 = local_38;
            CharSet<unsigned_int>::SetRange
                      ((CharSet<unsigned_int> *)local_370,local_38->ctAllocator,0x2d,0x2d);
          }
          CharSet<unsigned_int>::UnionInPlace
                    ((CharSet<unsigned_int> *)local_370,pPVar22->ctAllocator,&local_3d8.set);
          local_4c = 0xffffffff;
          bVar23 = 1;
          uVar33 = 0xffffffff;
        }
        else {
          uVar33 = 0;
          bVar23 = 0;
        }
      }
      else {
        if (EVar3 == L'-') {
          pEVar16 = pPVar22->inputLim;
          if (CVar30 != 0xffffffff && local_4c == 0xffffffff) {
            if (pEVar16 < pEVar27 + 1) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pNVar15 = local_48;
              *(uint32 *)&local_48->_vptr_Node = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
              if (!bVar9) goto LAB_00ebbbaa;
              *(uint32 *)&pNVar15->_vptr_Node = 0;
              pEVar16 = local_38->inputLim;
              pEVar27 = local_38->next;
              pPVar22 = local_38;
            }
            if (pEVar27[1] != L']') {
              if (pEVar16 < pEVar27 + 1) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                pNVar15 = local_48;
                *(uint32 *)&local_48->_vptr_Node = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
                if (!bVar9) goto LAB_00ebbbaa;
                *(uint32 *)&pNVar15->_vptr_Node = 0;
                pEVar27 = local_38->next;
                pPVar22 = local_38;
              }
              pPVar22->next = pEVar27 + 1;
              CVar31 = 0xffffffff;
              bVar23 = 0;
              local_4c = CVar30;
              goto LAB_00ebaa0b;
            }
          }
          if (pEVar16 < pEVar27 + 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pNVar15 = local_48;
            *(uint32 *)&local_48->_vptr_Node = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar9) goto LAB_00ebbbaa;
            *(uint32 *)&pNVar15->_vptr_Node = 0;
            pEVar27 = local_38->next;
            pPVar22 = local_38;
          }
          pPVar22->next = pEVar27 + 1;
          uVar33 = 0x2d;
        }
        else {
          if (pPVar22->inputLim <= pEVar27) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pNVar15 = local_48;
            *(uint32 *)&local_48->_vptr_Node = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x25d,"(!IsEOF())","!IsEOF()");
            if (!bVar9) goto LAB_00ebbbaa;
            *(uint32 *)&pNVar15->_vptr_Node = 0;
            pEVar27 = local_38->next;
            pPVar22 = local_38;
          }
          pPVar22->next = pEVar27 + 1;
          uVar33 = (ulong)(ushort)*pEVar27;
          if (uVar33 < 0x100) {
            if ((ASCIIChars::classes[uVar33] & 2) != 0) {
LAB_00eba9f5:
              Fail(pPVar22,-0x7ff5fc0c);
              pPVar22 = local_38;
            }
          }
          else if ((*pEVar27 & 0xfffeU) == 0x2028) goto LAB_00eba9f5;
        }
LAB_00ebaa06:
        bVar23 = 0;
      }
LAB_00ebaa0b:
      pNVar15 = local_48;
      uVar28 = local_4c;
      CVar30 = (Char)uVar33;
      if ((~bVar35 & CVar31 == 0xffffffff) == 0) {
        if ((bVar35 & 1) == 0) {
          if (local_4c == 0xffffffff) {
            CharSet<unsigned_int>::SetRange
                      ((CharSet<unsigned_int> *)local_370,local_38->ctAllocator,CVar31,CVar31);
            local_4c = 0xffffffff;
            pPVar22 = local_38;
            goto LAB_00ebab36;
          }
          if (CVar30 < local_4c) {
            if (pPVar22->unicodeFlagPresent == true) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(uint32 *)&pNVar15->_vptr_Node = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0x8bd,"(!unicodeFlagPresent)","!unicodeFlagPresent");
              if (!bVar9) goto LAB_00ebbbaa;
              *(uint32 *)&pNVar15->_vptr_Node = 0;
              pPVar22 = local_38;
            }
            Fail(pPVar22,-0x7ff5ec63);
          }
          pAVar25 = local_38->ctAllocator;
        }
        else {
          if (pPVar22->unicodeFlagPresent == true) {
            Fail(pPVar22,-0x7ff5e9d3);
          }
          if (CVar30 != 0xffffffff) {
            CharSet<unsigned_int>::SetRange
                      ((CharSet<unsigned_int> *)local_370,local_38->ctAllocator,CVar30,CVar30);
          }
          pAVar25 = local_38->ctAllocator;
          uVar28 = 0x2d;
          CVar30 = 0x2d;
        }
        CharSet<unsigned_int>::SetRange((CharSet<unsigned_int> *)local_370,pAVar25,uVar28,CVar30);
        local_4c = 0xffffffff;
        uVar33 = 0xffffffff;
        pPVar22 = local_38;
      }
LAB_00ebab36:
      pEVar27 = pPVar22->next;
      if (pPVar22->inputLim < pEVar27) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        pNVar15 = local_48;
        *(uint32 *)&local_48->_vptr_Node = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar9) goto LAB_00ebbbaa;
        *(uint32 *)&pNVar15->_vptr_Node = 0;
        pEVar27 = local_38->next;
        pPVar22 = local_38;
      }
      EVar3 = *pEVar27;
      bVar23 = bVar23 & EVar3 == L'-';
      bVar35 = bStack_58;
    } while (EVar3 != L']');
    CVar31 = (Char)uVar33;
    if (CVar31 != 0xffffffff) {
      CharSet<unsigned_int>::SetRange
                ((CharSet<unsigned_int> *)local_370,local_38->ctAllocator,CVar31,CVar31);
      pPVar22 = local_38;
    }
  }
  if (pPVar22->unicodeFlagPresent == false) {
    if (&DAT_00000004 < (undefined1 *)((long)local_370 - 1U)) {
      if (local_370 == (undefined1  [8])0x0) {
        uVar10 = CharBitvec::Count((CharBitvec *)&codePointSet);
        local_48 = (Node *)CONCAT44(extraout_var,uVar10);
      }
      else {
        if ((local_370 != (undefined1  [8])&CharSetFull::Instance) &&
           (uVar28 = (*(*(_func_int ***)local_370)[0xb])(local_370,2), 0xff00 < uVar28)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar9) goto LAB_00ebbbaa;
          *puVar14 = 0;
        }
        uVar10 = CharBitvec::Count((CharBitvec *)&codePointSet);
        if (local_370 == (undefined1  [8])&CharSetFull::Instance) {
          iVar32 = 0xff00;
        }
        else {
          iVar32 = (*(*(_func_int ***)local_370)[0xb])(local_370,2);
        }
        local_48 = (Node *)(ulong)(iVar32 + uVar10);
      }
    }
    else {
      local_48 = (Node *)(ulong)(local_370._0_4_ - 1);
    }
    _bStack_58 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    lVar29 = 0;
    iVar32 = 0;
    pPVar22 = local_38;
    do {
      ppuVar4 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar29);
      if (&DAT_00000004 < (undefined1 *)((long)ppuVar4 + -1)) {
        if (ppuVar4 == (undefined **)0x0) {
          uVar10 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar29));
          pPVar22 = local_38;
        }
        else {
          if ((ppuVar4 != &CharSetFull::Instance) &&
             (uVar28 = (**(code **)(*ppuVar4 + 0x58))(ppuVar4,2), 0xff00 < uVar28)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = _bStack_58;
            *_bStack_58 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar9) goto LAB_00ebbbaa;
            *puVar14 = 0;
          }
          uVar10 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar29));
          ppuVar4 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar29);
          if (ppuVar4 == &CharSetFull::Instance) {
            iVar11 = 0xff00;
          }
          else {
            iVar11 = (**(code **)(*ppuVar4 + 0x58))(ppuVar4,2);
          }
          uVar10 = iVar11 + uVar10;
          pPVar22 = local_38;
        }
      }
      else {
        uVar10 = (int)ppuVar4 - 1;
      }
      iVar32 = iVar32 + uVar10;
      lVar29 = lVar29 + 0x28;
    } while (lVar29 != 0x2a8);
    if ((int)local_48 != iVar32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = _bStack_58;
      *_bStack_58 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x8e2,"(codePointSet.SimpleCharCount() == codePointSet.Count())",
                         "codePointSet.SimpleCharCount() == codePointSet.Count()");
      if (!bVar9) goto LAB_00ebbbaa;
      *puVar14 = 0;
      pPVar22 = local_38;
    }
    pNVar15 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar22->ctAllocator,0x364470);
    *(uint *)&pNVar15->field_0xc = *(uint *)&pNVar15->field_0xc & 0xffff8000;
    pNVar15->tag = MatchSet;
    pNVar15->features = 0;
    pNVar15->firstSet = (CharSet<char16_t> *)0x0;
    pNVar15->followSet = (CharSet<char16_t> *)0x0;
    (pNVar15->prevConsumes).lower = 0;
    auVar37 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
    *(undefined1 (*) [16])&(pNVar15->prevConsumes).upper = auVar37;
    (pNVar15->followConsumes).upper = 0xffffffff;
    pNVar15->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
    *(bool *)&pNVar15[1]._vptr_Node = local_3a == L'^';
    *(undefined1 *)((long)&pNVar15[1]._vptr_Node + 1) = 1;
    pNVar34 = &pNVar15[1].tag;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar34);
    pAVar25 = pPVar22->ctAllocator;
    pCVar26 = (CharSet<unsigned_int> *)local_370;
  }
  else {
    if (((pPVar22->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x8e9,"(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                         "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
      if (!bVar9) goto LAB_00ebbbaa;
      *puVar14 = 0;
      pPVar22 = local_38;
    }
    if (local_370 == (undefined1  [8])&DAT_00000001) {
      uVar33 = 0xffffffffffffffff;
      plVar21 = (long *)((long)&codePointSet.characterPlanes[0].rep + 0x20);
      do {
        if (uVar33 == 0xf) goto LAB_00ebacfa;
        uVar33 = uVar33 + 1;
        lVar29 = *plVar21;
        plVar21 = plVar21 + 5;
      } while (lVar29 == 1);
      if (0xf < uVar33) {
LAB_00ebacfa:
        pNVar15 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar22->ctAllocator,0x364470);
        pNVar15->tag = MatchSet;
        pNVar15->features = 0;
        *(uint *)&pNVar15->field_0xc = *(uint *)&pNVar15->field_0xc & 0xffff8000;
        pNVar15->firstSet = (CharSet<char16_t> *)0x0;
        pNVar15->followSet = (CharSet<char16_t> *)0x0;
        (pNVar15->prevConsumes).lower = 0;
        auVar37 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
        *(undefined1 (*) [16])&(pNVar15->prevConsumes).upper = auVar37;
        (pNVar15->followConsumes).upper = 0xffffffff;
        pNVar15->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
        *(undefined2 *)&pNVar15[1]._vptr_Node = 0x100;
        CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar15[1].tag);
        return pNVar15;
      }
    }
    local_48 = (Node *)&codePointSet;
    if ((local_3a != L'^') && (pPVar22->caseInsensitiveFlagPresent == false)) {
      _bStack_58 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar29 = 0;
      iVar32 = 0;
      do {
        ppuVar4 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar29);
        if (&DAT_00000004 < (undefined1 *)((long)ppuVar4 + -1)) {
          if (ppuVar4 == (undefined **)0x0) {
            uVar10 = CharBitvec::Count((CharBitvec *)
                                       ((long)&codePointSet.characterPlanes[0].rep + lVar29));
          }
          else {
            if ((ppuVar4 != &CharSetFull::Instance) &&
               (uVar28 = (**(code **)(*ppuVar4 + 0x58))(ppuVar4,2), 0xff00 < uVar28)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = _bStack_58;
              *_bStack_58 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x252,
                                 "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                 ,
                                 "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                );
              if (!bVar9) goto LAB_00ebbbaa;
              *puVar14 = 0;
            }
            uVar10 = CharBitvec::Count((CharBitvec *)
                                       ((long)&codePointSet.characterPlanes[0].rep + lVar29));
            ppuVar4 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar29);
            if (ppuVar4 == &CharSetFull::Instance) {
              iVar11 = 0xff00;
            }
            else {
              iVar11 = (**(code **)(*ppuVar4 + 0x58))(ppuVar4,2);
            }
            uVar10 = iVar11 + uVar10;
          }
        }
        else {
          uVar10 = (int)ppuVar4 - 1;
        }
        iVar32 = iVar32 + uVar10;
        lVar29 = lVar29 + 0x28;
      } while (lVar29 != 0x2a8);
      pPVar22 = local_38;
      if (iVar32 == 1) {
        codePointValue = CharSet<unsigned_int>::Singleton((CharSet<unsigned_int> *)local_370);
        pPVar22 = local_38;
        if (codePointValue < 0x10000) {
          pNVar15 = (Node *)new<Memory::ArenaAllocator>(0x48,local_38->ctAllocator,0x364470);
          pNVar15->tag = MatchChar;
          pNVar15->features = 0;
          *(uint *)&pNVar15->field_0xc = *(uint *)&pNVar15->field_0xc & 0xffff8000;
          pNVar15->firstSet = (CharSet<char16_t> *)0x0;
          pNVar15->followSet = (CharSet<char16_t> *)0x0;
          (pNVar15->prevConsumes).lower = 0;
          *(undefined8 *)&(pNVar15->prevConsumes).upper = 0xffffffff;
          *(undefined8 *)&(pNVar15->thisConsumes).upper = 0xffffffff;
          (pNVar15->followConsumes).upper = 0xffffffff;
          pNVar15->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542a10;
          *(undefined1 *)&pNVar15[1].tag = Empty;
          auVar37 = pshuflw(ZEXT416(codePointValue),ZEXT416(codePointValue),0);
          pNVar15[1]._vptr_Node = (_func_int **)auVar37._0_8_;
        }
        else {
          if (local_38->unicodeFlagPresent == false) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = _bStack_58;
            *_bStack_58 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x902,"(unicodeFlagPresent)","unicodeFlagPresent");
            if (!bVar9) goto LAB_00ebbbaa;
            *puVar14 = 0;
          }
          Js::NumberUtilities::CodePointAsSurrogatePair
                    (codePointValue,(char16 *)local_928,
                     (char16 *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8));
          pPVar22 = local_38;
          pNVar15 = CreateSurrogatePairAtom
                              (local_38,local_928._0_2_,
                               negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_);
        }
        CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_370,pPVar22->ctAllocator);
        return pNVar15;
      }
    }
    CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_928);
    pPVar8 = local_38;
    if (pPVar22->caseInsensitiveFlagPresent == false) {
      if (local_3a == L'^') {
        local_48 = (Node *)&negatedSet;
        CharSet<unsigned_int>::ToComplement
                  ((CharSet<unsigned_int> *)local_370,local_38->ctAllocator,
                   (CharSet<unsigned_int> *)local_928);
        CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)local_370,pPVar8->ctAllocator);
        pCStack_68 = (CharSet<unsigned_int> *)local_928;
      }
    }
    else {
      puVar2 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
      CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)puVar2);
      pCStack_68 = (CharSet<unsigned_int> *)local_370;
      CharSet<unsigned_int>::ToEquivClass
                (pCStack_68,pPVar22->ctAllocator,(CharSet<unsigned_int> *)puVar2);
      _bStack_58 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar29 = 0;
      uVar28 = 0;
      do {
        ppuVar4 = *(undefined ***)((long)&negatedSet.characterPlanes[0x10].rep + lVar29 + 0x20);
        if (&DAT_00000004 < (undefined1 *)((long)ppuVar4 + -1)) {
          if (ppuVar4 == (undefined **)0x0) {
            uVar10 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar29));
          }
          else {
            if ((ppuVar4 != &CharSetFull::Instance) &&
               (uVar36 = (**(code **)(*ppuVar4 + 0x58))(ppuVar4,2), 0xff00 < uVar36)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = _bStack_58;
              *_bStack_58 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x252,
                                 "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                 ,
                                 "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                );
              if (!bVar9) goto LAB_00ebbbaa;
              *puVar14 = 0;
            }
            uVar10 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar29));
            ppuVar4 = *(undefined ***)((long)&negatedSet.characterPlanes[0x10].rep + lVar29 + 0x20);
            if (ppuVar4 == &CharSetFull::Instance) {
              iVar32 = 0xff00;
            }
            else {
              iVar32 = (**(code **)(*ppuVar4 + 0x58))(ppuVar4,2);
            }
            uVar10 = iVar32 + uVar10;
          }
        }
        else {
          uVar10 = (int)ppuVar4 - 1;
        }
        uVar28 = uVar28 + uVar10;
        lVar29 = lVar29 + 0x28;
      } while (lVar29 != 0x2a8);
      lVar29 = 0;
      uVar36 = 0;
      pPVar22 = local_38;
      do {
        ppuVar4 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar29);
        if (&DAT_00000004 < (undefined1 *)((long)ppuVar4 + -1)) {
          if (ppuVar4 == (undefined **)0x0) {
            uVar10 = CharBitvec::Count((CharBitvec *)
                                       ((long)&codePointSet.characterPlanes[0].rep + lVar29));
            pPVar22 = local_38;
          }
          else {
            if ((ppuVar4 != &CharSetFull::Instance) &&
               (uVar12 = (**(code **)(*ppuVar4 + 0x58))(ppuVar4,2), 0xff00 < uVar12)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = _bStack_58;
              *_bStack_58 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x252,
                                 "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                 ,
                                 "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                );
              if (!bVar9) goto LAB_00ebbbaa;
              *puVar14 = 0;
            }
            uVar10 = CharBitvec::Count((CharBitvec *)
                                       ((long)&codePointSet.characterPlanes[0].rep + lVar29));
            ppuVar4 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar29);
            if (ppuVar4 == &CharSetFull::Instance) {
              iVar32 = 0xff00;
            }
            else {
              iVar32 = (**(code **)(*ppuVar4 + 0x58))(ppuVar4,2);
            }
            uVar10 = iVar32 + uVar10;
            pPVar22 = local_38;
          }
        }
        else {
          uVar10 = (int)ppuVar4 - 1;
        }
        uVar36 = uVar36 + uVar10;
        lVar29 = lVar29 + 0x28;
      } while (lVar29 != 0x2a8);
      if (uVar28 < uVar36) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = _bStack_58;
        *_bStack_58 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x925,"(caseEquivalent.Count() >= codePointSet.Count())",
                           "caseEquivalent.Count() >= codePointSet.Count()");
        if (!bVar9) goto LAB_00ebbbaa;
        *puVar14 = 0;
        pPVar22 = local_38;
      }
      if (local_3a == L'^') {
        CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_370,pPVar22->ctAllocator);
        puVar2 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
        CharSet<unsigned_int>::ToComplement
                  ((CharSet<unsigned_int> *)puVar2,pPVar22->ctAllocator,
                   (CharSet<unsigned_int> *)local_370);
        CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)puVar2,pPVar22->ctAllocator);
      }
      else {
        CharSet<unsigned_int>::CloneFrom
                  ((CharSet<unsigned_int> *)local_370,pPVar22->ctAllocator,
                   (CharSet<unsigned_int> *)
                   (negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6));
      }
    }
    _bStack_58 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pCVar26 = pCStack_68;
    lVar29 = 0;
    uVar10 = 0;
    do {
      ppuVar4 = *(undefined ***)((long)&pCStack_68->characterPlanes[0].rep + lVar29);
      if (&DAT_00000004 < (undefined1 *)((long)ppuVar4 + -1)) {
        if (ppuVar4 == (undefined **)0x0) {
          uVar13 = CharBitvec::Count((CharBitvec *)
                                     ((long)&pCVar26->characterPlanes[0].rep + lVar29 + 8));
        }
        else {
          if ((ppuVar4 != &CharSetFull::Instance) &&
             (uVar28 = (**(code **)(*ppuVar4 + 0x58))(ppuVar4,2), 0xff00 < uVar28)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = _bStack_58;
            *_bStack_58 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar9) goto LAB_00ebbbaa;
            *puVar14 = 0;
          }
          uVar13 = CharBitvec::Count((CharBitvec *)
                                     ((long)&pCVar26->characterPlanes[0].rep + lVar29 + 8));
          ppuVar4 = *(undefined ***)((long)&pCStack_68->characterPlanes[0].rep + lVar29);
          if (ppuVar4 == &CharSetFull::Instance) {
            iVar32 = 0xff00;
          }
          else {
            iVar32 = (**(code **)(*ppuVar4 + 0x58))(ppuVar4,2);
          }
          uVar13 = iVar32 + uVar13;
        }
      }
      else {
        uVar13 = (int)ppuVar4 - 1;
      }
      pNVar15 = local_48;
      uVar10 = uVar10 + uVar13;
      lVar29 = lVar29 + 0x28;
    } while (lVar29 != 0x2a8);
    pCVar5 = pCStack_68->characterPlanes[0].rep.full.root;
    if (&DAT_00000004 < (undefined1 *)((long)&pCVar5[-1]._vptr_CharSetNode + 7)) {
      if (pCVar5 == (CharSetNode *)0x0) {
        uVar13 = CharBitvec::Count((CharBitvec *)local_48);
      }
      else {
        if ((pCVar5 != (CharSetNode *)&CharSetFull::Instance) &&
           (uVar28 = (*pCVar5->_vptr_CharSetNode[0xb])(pCVar5,2), 0xff00 < uVar28)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = _bStack_58;
          *_bStack_58 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar9) goto LAB_00ebbbaa;
          *puVar14 = 0;
        }
        uVar13 = CharBitvec::Count((CharBitvec *)pNVar15);
        pCVar5 = pCStack_68->characterPlanes[0].rep.full.root;
        if (pCVar5 == (CharSetNode *)&CharSetFull::Instance) {
          iVar32 = 0xff00;
        }
        else {
          iVar32 = (*pCVar5->_vptr_CharSetNode[0xb])(pCVar5,2);
        }
        uVar13 = iVar32 + uVar13;
      }
    }
    else {
      uVar13 = (int)pCVar5 - 1;
    }
    pPVar22 = local_38;
    if (uVar10 != uVar13) {
      if (uVar13 == 0) {
        pNVar18 = (Node *)0x0;
        pNVar15 = (Node *)0x0;
      }
      else {
        negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_ = 0xffff;
        local_6c = local_6c & 0xffff0000;
        bVar9 = CharSet<char16_t>::GetNextRange
                          (pCStack_68->characterPlanes,L'\xd800',
                           (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                           (Char *)&local_6c);
        uVar7 = negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_;
        pNVar15 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar22->ctAllocator,0x364470);
        pNVar15->tag = MatchSet;
        pNVar15->features = 0;
        *(uint *)&pNVar15->field_0xc = *(uint *)&pNVar15->field_0xc & 0xffff8000;
        pNVar15->firstSet = (CharSet<char16_t> *)0x0;
        pNVar15->followSet = (CharSet<char16_t> *)0x0;
        (pNVar15->prevConsumes).lower = 0;
        auVar37 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
        *(undefined1 (*) [16])&(pNVar15->prevConsumes).upper = auVar37;
        (pNVar15->followConsumes).upper = 0xffffffff;
        pNVar15->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
        *(undefined2 *)&pNVar15[1]._vptr_Node = 0x100;
        pNVar34 = &pNVar15[1].tag;
        CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar34);
        pCVar26 = pCStack_68;
        if ((bVar9) && ((ushort)uVar7 < 0xe000)) {
          CharSet<unsigned_int>::CloneNonSurrogateCodeUnitsTo
                    (pCStack_68,pPVar22->ctAllocator,(CharSet<char16_t> *)pNVar34);
          pPVar22 = local_38;
          pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x68,local_38->ctAllocator,0x364470);
          pNVar18->tag = MatchSet;
          pNVar18->features = 0;
          *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
          pNVar18->firstSet = (CharSet<char16_t> *)0x0;
          pNVar18->followSet = (CharSet<char16_t> *)0x0;
          (pNVar18->prevConsumes).lower = 0;
          auVar37 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
          *(undefined1 (*) [16])&(pNVar18->prevConsumes).upper = auVar37;
          (pNVar18->followConsumes).upper = 0xffffffff;
          pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
          *(undefined2 *)&pNVar18[1]._vptr_Node = 0x100;
          CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar18[1].tag);
          CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo
                    (pCVar26,pPVar22->ctAllocator,(CharSet<char16_t> *)&pNVar18[1].tag);
        }
        else {
          CharSet<unsigned_int>::CloneSimpleCharsTo
                    (pCStack_68,pPVar22->ctAllocator,(CharSet<char16_t> *)pNVar34);
          pNVar18 = (Node *)0x0;
          pPVar22 = local_38;
        }
      }
      if (pPVar22->unicodeFlagPresent == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = _bStack_58;
        *_bStack_58 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x954,"(unicodeFlagPresent)","unicodeFlagPresent");
        if (!bVar9) {
LAB_00ebbbaa:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar14 = 0;
        pPVar22 = local_38;
      }
      if (pNVar15 == (Node *)0x0) {
        pAVar19 = (AltNode *)0x0;
      }
      else {
        pAVar19 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar22->ctAllocator,0x364470);
        (pAVar19->super_Node).tag = Alt;
        (pAVar19->super_Node).features = 0;
        puVar1 = &(pAVar19->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pAVar19->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pAVar19->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pAVar19->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pAVar19->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pAVar19->super_Node).thisConsumes.upper = 0xffffffff;
        (pAVar19->super_Node).followConsumes.upper = 0xffffffff;
        (pAVar19->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
        pAVar19->head = pNVar15;
        pAVar19->switchSize = 0;
        pAVar19->tail = (AltNode *)0x0;
        pAVar19->runtimeTrie = (RuntimeCharTrie *)0x0;
        *(undefined8 *)((long)&pAVar19->runtimeTrie + 5) = 0;
      }
      negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] = 0;
      local_6c = 0;
      local_48 = pNVar18;
      bVar9 = CharSet<unsigned_int>::GetNextRange
                        (pCStack_68,0x10000,
                         (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                         &local_6c);
      puVar14 = _bStack_58;
      lastAltNode = pAVar19;
      if (bVar9) {
        do {
          if (negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] == local_6c) {
            pAVar20 = AppendSurrogatePairToDisjunction
                                (local_38,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                                 lastAltNode);
          }
          else {
            pAVar20 = AppendSurrogateRangeToDisjunction
                                (local_38,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                                 local_6c,lastAltNode);
          }
          if (pAVar19 == (AltNode *)0x0) {
            pAVar19 = pAVar20;
          }
          if (pAVar20 == (AltNode *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x96a,"(currentTail != nullptr)","currentTail != nullptr");
            if (!bVar9) goto LAB_00ebbbaa;
            *puVar14 = 0;
          }
          do {
            lastAltNode = pAVar20;
            pAVar20 = lastAltNode->tail;
          } while (lastAltNode->tail != (AltNode *)0x0);
          bVar9 = CharSet<unsigned_int>::GetNextRange
                            (pCStack_68,local_6c + 1,
                             (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                             &local_6c);
        } while (bVar9);
      }
      pPVar22 = local_38;
      pNVar15 = local_48;
      if (local_48 != (Node *)0x0) {
        pAVar20 = (AltNode *)new<Memory::ArenaAllocator>(0x60,local_38->ctAllocator,0x364470);
        (pAVar20->super_Node).tag = Alt;
        (pAVar20->super_Node).features = 0;
        puVar1 = &(pAVar20->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pAVar20->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pAVar20->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pAVar20->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pAVar20->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pAVar20->super_Node).thisConsumes.upper = 0xffffffff;
        (pAVar20->super_Node).followConsumes.upper = 0xffffffff;
        (pAVar20->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
        pAVar20->head = pNVar15;
        pAVar20->switchSize = 0;
        pAVar20->tail = (AltNode *)0x0;
        pAVar20->runtimeTrie = (RuntimeCharTrie *)0x0;
        *(undefined8 *)((long)&pAVar20->runtimeTrie + 5) = 0;
        lastAltNode->tail = pAVar20;
      }
      CharSet<unsigned_int>::Clear(pCStack_68,pPVar22->ctAllocator);
      if (pAVar19 != (AltNode *)0x0) {
        if (pAVar19->tail != (AltNode *)0x0) {
          return &pAVar19->super_Node;
        }
        return pAVar19->head;
      }
      return (Node *)0x0;
    }
    pNVar15 = (Node *)new<Memory::ArenaAllocator>(0x68,local_38->ctAllocator,0x364470);
    *(uint *)&pNVar15->field_0xc = *(uint *)&pNVar15->field_0xc & 0xffff8000;
    pNVar15->tag = MatchSet;
    pNVar15->features = 0;
    pNVar15->firstSet = (CharSet<char16_t> *)0x0;
    pNVar15->followSet = (CharSet<char16_t> *)0x0;
    (pNVar15->prevConsumes).lower = 0;
    auVar37 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
    *(undefined1 (*) [16])&(pNVar15->prevConsumes).upper = auVar37;
    (pNVar15->followConsumes).upper = 0xffffffff;
    pNVar15->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
    *(bool *)&pNVar15[1]._vptr_Node = local_3a == L'^';
    *(undefined1 *)((long)&pNVar15[1]._vptr_Node + 1) = 1;
    pNVar34 = &pNVar15[1].tag;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar34);
    pAVar25 = pPVar22->ctAllocator;
    pCVar26 = pCStack_68;
  }
  CharSet<unsigned_int>::CloneSimpleCharsTo(pCVar26,pAVar25,(CharSet<char16_t> *)pNVar34);
  return pNVar15;
}

Assistant:

Node* Parser<P, IsLiteral>::CharacterClassPass1()
    {
        Assert(containsSurrogates ? unicodeFlagPresent : true);

        CharSet<codepoint_t> codePointSet;

        MatchSetNode deferredSetNode(false, false);
        MatchCharNode deferredCharNode(0);

        bool isNegation = false;

        if (ECLookahead() == '^')
        {
            isNegation = true;
            ECConsume();
        }

        // We aren't expecting any terminating null characters, only embedded ones that should treated as valid characters.
        // CharacterClassPass0 should have taken care of terminating null.
        codepoint_t pendingCodePoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        EncodedChar nextChar = ECLookahead();
        bool previousWasASurrogate = false;
        bool currIsACharSet = false;
        bool prevWasACharSetAndPartOfRange = false;
        bool prevprevWasACharSetAndPartOfRange = false;

        while(nextChar != ']')
        {
            codepoint_t codePointToSet = INVALID_CODEPOINT;

            // Consume ahead of time if we have two backslashes, both cases below (previously Tracked surrogate pair, and ClassEscapePass1) assume it is.
            if (nextChar == '\\')
            {
                ECConsume();
            }

            // These if-blocks are the logical ClassAtomPass1, they weren't grouped into a method to simplify dealing with multiple out parameters.
            if (containsSurrogates && this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
            {
                codePointToSet = pendingCodePoint;

                pendingCodePoint = this->currentSurrogatePairNode->value;
                Assert(ECCanConsume(this->currentSurrogatePairNode->length));
                ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
                this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
                this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
            }
            else if (nextChar == '\\')
            {
                Node* returnedNode = ClassEscapePass1(&deferredCharNode, &deferredSetNode, previousWasASurrogate);
                codePointToSet = pendingCodePoint;

                if (returnedNode->tag == Node::MatchSet)
                {
                    if (pendingRangeStart != INVALID_CODEPOINT)
                    {
                        if (unicodeFlagPresent)
                        {
                            //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                            //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                            Fail(JSERR_UnicodeRegExpRangeContainsCharClass); //From #sec-patterns-static-semantics-early-errors-annexb
                        }

                        codePointSet.Set(ctAllocator, '-');
                    }

                    pendingCodePoint = INVALID_CODEPOINT;
                    pendingRangeStart = INVALID_CODEPOINT;
                    codePointSet.UnionInPlace(ctAllocator, deferredSetNode.set);
                    currIsACharSet = true;
                }
                else
                {
                    // Just a character
                    pendingCodePoint = deferredCharNode.cs[0];
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || pendingCodePoint == INVALID_CODEPOINT || ECLookahead(1) == ']')
                {
                    // - is just a char, or end of a range.
                    codePointToSet = pendingCodePoint;
                    pendingCodePoint = '-';
                    ECConsume();
                }
                else
                {
                    pendingRangeStart = pendingCodePoint;
                    ECConsume();
                }
            }
            else
            {
                // Just a character, consume it
                codePointToSet = pendingCodePoint;
                pendingCodePoint = NextChar();
            }

            if (codePointToSet != INVALID_CODEPOINT || prevprevWasACharSetAndPartOfRange)
            {
                if (prevprevWasACharSetAndPartOfRange)
                {
                    //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                    //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                    if (unicodeFlagPresent)
                    {
                        Fail(JSERR_UnicodeRegExpRangeContainsCharClass);
                    }

                    if (pendingCodePoint != INVALID_CODEPOINT)
                    {
                        codePointSet.Set(ctAllocator, pendingCodePoint);
                    }

                    codePointSet.Set(ctAllocator, '-'); //Add '-' to set because a range was detected but turned out to be a union of character set with '-' and another atom.
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else if (pendingRangeStart != INVALID_CODEPOINT)
                {
                    if (pendingRangeStart > pendingCodePoint)
                    {
                        //We have no unicodeFlag, but current range contains surrogates, thus we may end up having to throw a "Syntax" error here
                        //This breaks the notion of Pass0 check for valid syntax, because we don't know if we have a unicode option
                        Assert(!unicodeFlagPresent);
                        Fail(JSERR_RegExpBadRange);
                    }
                    
                    codePointSet.SetRange(ctAllocator, pendingRangeStart, pendingCodePoint);
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else
                {
                    codePointSet.Set(ctAllocator, codePointToSet);
                }
            }

            nextChar = ECLookahead();
            prevprevWasACharSetAndPartOfRange = prevWasACharSetAndPartOfRange;
            prevWasACharSetAndPartOfRange = currIsACharSet && nextChar == '-';
            currIsACharSet = false;
        }

        if (pendingCodePoint != INVALID_CODEPOINT)
        {
            codePointSet.Set(ctAllocator, pendingCodePoint);
        }

        // At this point, we have a complete set of codepoints representing the range.
        // Before performing translation of any kind, we need to do some case filling.
        // At the point of this comment, there are no case mappings going cross-plane between simple
        // characters (< 0x10000) and supplementary characters (>= 0x10000)
        // However, it might still be the case, and this has to be handled.

        // On the other hand, we don't want to prevent optimizations that expect non-casefolded sets from happening.
        // At least for simple characters.

        // The simple case, is when the unicode flag isn't specified, we can go ahead and return the simple set.
        // Negations and case mappings will be handled later.
        if (!unicodeFlagPresent)
        {
            Assert(codePointSet.SimpleCharCount() == codePointSet.Count());
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            codePointSet.CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        // Everything past here must be under the flag
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        if (codePointSet.IsEmpty())
        {
            return Anew(ctAllocator, MatchSetNode, false, false);
        }

        Node* prefixNode = nullptr;
        Node* suffixNode = nullptr;

        CharSet<codepoint_t> *toUseForTranslation = &codePointSet;

        // If a singleton, return a simple character
        bool isSingleton = !this->caseInsensitiveFlagPresent && !isNegation && codePointSet.IsSingleton();
        if (isSingleton)
        {
            codepoint_t singleton = codePointSet.Singleton();
            Node* toReturn = nullptr;

            if (singleton < 0x10000)
            {
                toReturn = Anew(ctAllocator, MatchCharNode, (char16)singleton);
            }
            else
            {
                Assert(unicodeFlagPresent);
                char16 lowerSurrogate, upperSurrogate;
                Js::NumberUtilities::CodePointAsSurrogatePair(singleton, &lowerSurrogate, &upperSurrogate);
                toReturn = CreateSurrogatePairAtom(lowerSurrogate, upperSurrogate);
            }

            codePointSet.Clear(ctAllocator);
            return toReturn;
        }

        // If negation, we want to complement the simple chars.
        // When a set is negated, optimizations skip checking if applicable, so we can go ahead and negate it here.
        CharSet<codepoint_t> negatedSet;

        if (!this->caseInsensitiveFlagPresent)
        {
            if (isNegation)
            {
                // Complement all characters, and use it as the set toTranslate
                codePointSet.ToComplement(ctAllocator, negatedSet);
            }

            toUseForTranslation = isNegation ? &negatedSet : &codePointSet;

            if (isNegation)
            {
                // Clear this, as we will no longer need this.
                codePointSet.FreeBody(ctAllocator);
            }
        }
        else
        {
            CharSet<codepoint_t> caseEquivalent;
            codePointSet.ToEquivClass(ctAllocator, caseEquivalent);
            // Equiv set can't have a reduced count of chars
            Assert(caseEquivalent.Count() >= codePointSet.Count());

            // Here we have a regex that has both case insensitive and unicode options.
            // The range might also be negated. If it is negated, we can go ahead and negate
            // the entire set as well as fill in cases, as optimizations wouldn't kick in anyways.
            if (isNegation)
            {
                codePointSet.Clear(ctAllocator);
                caseEquivalent.ToComplement(ctAllocator, codePointSet);
                caseEquivalent.FreeBody(ctAllocator);
            }
            else
            {
                codePointSet.CloneFrom(ctAllocator, caseEquivalent);
            }

            Assert(toUseForTranslation == &codePointSet);
        }

        uint totalCodePointsCount = toUseForTranslation->Count();
        uint simpleCharsCount = toUseForTranslation->SimpleCharCount();
        if (totalCodePointsCount == simpleCharsCount)
        {
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            toUseForTranslation->CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        if  (simpleCharsCount > 0)
        {
            if (!toUseForTranslation->ContainSurrogateCodeUnits())
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSimpleCharsTo(ctAllocator, node->set);
                prefixNode = node;
            }
            else
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneNonSurrogateCodeUnitsTo(ctAllocator, node->set);
                prefixNode = node;
                node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSurrogateCodeUnitsTo(ctAllocator, node->set);
                suffixNode = node;
            }
        }

        Assert(unicodeFlagPresent);
        AltNode *headToReturn = prefixNode == nullptr ? nullptr : Anew(ctAllocator, AltNode, prefixNode, nullptr);
        AltNode *currentTail = headToReturn;

        codepoint_t charRangeSearchIndex = 0x10000, lowerCharOfRange = 0, upperCharOfRange = 0;

        while (toUseForTranslation->GetNextRange(charRangeSearchIndex, &lowerCharOfRange, &upperCharOfRange))
        {
            if (lowerCharOfRange == upperCharOfRange)
            {
                currentTail = this->AppendSurrogatePairToDisjunction(lowerCharOfRange, currentTail);
            }
            else
            {
                currentTail = this->AppendSurrogateRangeToDisjunction(lowerCharOfRange, upperCharOfRange, currentTail);
            }

            if (headToReturn == nullptr)
            {
                headToReturn = currentTail;
            }

            AnalysisAssert(currentTail != nullptr);
            while (currentTail->tail != nullptr)
            {
                currentTail = currentTail->tail;
            }
            charRangeSearchIndex = upperCharOfRange + 1;
        }

        if (suffixNode != nullptr)
        {
            currentTail->tail = Anew(ctAllocator, AltNode, suffixNode, nullptr);
        }
        toUseForTranslation->Clear(ctAllocator);

        if (headToReturn != nullptr && headToReturn->tail == nullptr)
        {
            return headToReturn->head;
        }
        return headToReturn;
    }